

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O3

void __thiscall
crnlib::
hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
::~hash_map(hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
            *this)

{
  raw_node *p;
  
  p = (this->m_values).m_p;
  if ((this->m_values).m_size == 0) {
    if (p != (raw_node *)0x0) {
      crnlib_free(p);
    }
  }
  else {
    if (p != (raw_node *)0x0) {
      crnlib_free(p);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    this->m_hash_shift = 0x20;
    this->m_num_valid = 0;
    this->m_grow_threshold = 0;
  }
  return;
}

Assistant:

inline ~hash_map()
        {
            clear();
        }